

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O2

void __thiscall zmq::dish_t::send_subscriptions(dish_t *this,pipe_t *pipe_)

{
  int iVar1;
  _Base_ptr p_Var2;
  int *piVar3;
  char *pcVar4;
  char *in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  msg_t msg;
  msg_t local_70;
  
  for (p_Var2 = (this->_subscriptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->_subscriptions)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = msg_t::init_join(&local_70);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      in_RCX = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
              ,0xe5);
      fflush(_stderr);
      zmq_abort(pcVar4);
    }
    iVar1 = msg_t::set_group(&local_70,*(char **)(p_Var2 + 1));
    __buf = extraout_RDX;
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      in_RCX = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
              ,0xe8);
      fflush(_stderr);
      zmq_abort(pcVar4);
      __buf = extraout_RDX_00;
    }
    pipe_t::write(pipe_,(int)&local_70,__buf,(size_t)in_RCX);
  }
  pipe_t::flush(pipe_);
  return;
}

Assistant:

void zmq::dish_t::send_subscriptions (pipe_t *pipe_)
{
    for (subscriptions_t::iterator it = _subscriptions.begin (),
                                   end = _subscriptions.end ();
         it != end; ++it) {
        msg_t msg;
        int rc = msg.init_join ();
        errno_assert (rc == 0);

        rc = msg.set_group (it->c_str ());
        errno_assert (rc == 0);

        //  Send it to the pipe.
        pipe_->write (&msg);
    }

    pipe_->flush ();
}